

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O0

void __thiscall
LinkedDefinitionsSection_RoundTripForPopulated_Test::TestBody
          (LinkedDefinitionsSection_RoundTripForPopulated_Test *this)

{
  allocator<pstore::repo::definition> *this_00;
  digest d;
  digest d_00;
  extent<pstore::repo::fragment> x;
  extent<pstore::repo::fragment> x_00;
  initializer_list<pstore::repo::definition> __l;
  initializer_list<pstore::repo::linked_definitions::value_type> __l_00;
  pointer triple;
  bool bVar1;
  value_type *first;
  value_type *pvVar2;
  size_type sVar3;
  database *db;
  element_type *this_01;
  iterator first_member;
  iterator last_member;
  parser<pstore::exchange::import_ns::callbacks> *this_02;
  Message *pMVar4;
  error_code *this_03;
  char *pcVar5;
  callbacks *this_04;
  __shared_ptr_access<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_05;
  element_type *this_06;
  element_type *peVar6;
  value_pointer_type ppVar7;
  element_type *peVar8;
  pointer pvVar9;
  pointer args_2;
  undefined4 in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c4;
  AssertHelper local_8e8;
  Message local_8e0;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_5;
  Message local_8c0;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_4;
  Message local_8a0;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_3;
  Message local_880;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_2;
  const_iterator impos;
  iterator expos;
  Message local_850;
  uint local_844;
  size_t local_840;
  undefined1 local_838 [8];
  AssertionResult gtest_ar_1;
  linked_definitions *linked;
  AssertHelper local_800;
  Message local_7f8;
  bool local_7e9;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar__1;
  shared_ptr<const_pstore::repo::fragment> imported_fragment;
  Message local_7c0;
  iterator local_7b8;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar;
  const_iterator pos;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragments_index;
  shared_ptr<pstore::exchange::import_ns::context> *ctxt;
  string local_598;
  AssertHelper local_578;
  char local_56d;
  coord local_56c;
  char local_561;
  string local_560;
  Message local_540;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> parser;
  string_mapping imported_names;
  undefined1 local_3e8 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction_1;
  undefined1 auStack_3a8 [7];
  mock_mutex mutex_1;
  digest imported_digest;
  _List_node_base local_378;
  pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> local_368;
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_340;
  undefined1 local_248 [8];
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  definition local_1d8;
  definition local_1a8;
  definition *local_178;
  size_type local_170;
  undefined1 local_168 [8];
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> definitions;
  typed_address<pstore::indirect_string> str;
  extent<pstore::repo::fragment> fext;
  digest fragment_digest;
  unique_lock<mock_mutex> local_120;
  undefined1 local_110 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_d0 [7];
  mock_mutex mutex;
  string exported_json;
  allocator<pstore::repo::linked_definitions::value_type> local_99;
  value_type local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  exported_content;
  typed_address<pstore::repo::definition> max_addr;
  digest referenced_compilation_digest;
  LinkedDefinitionsSection_RoundTripForPopulated_Test *this_local;
  
  max_addr.a_.a_ = (address)0x9abcdef0;
  exported_content.
  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
  local_68 = 1;
  uStack_60 = 0xffffffffffffffff;
  local_78 = 0x9abcdef0;
  uStack_70 = 0x12345678;
  local_98.index = 0;
  local_98.unused = 0;
  local_98.pointer.a_.a_ = (address)0xffffffffffffffff;
  local_98.compilation.v_._0_8_ = 0x9abcdef0;
  local_98.compilation.v_._8_8_ = 0x12345678;
  local_58 = &local_98;
  local_50 = 2;
  std::allocator<pstore::repo::linked_definitions::value_type>::allocator(&local_99);
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::vector((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
            *)local_48,__l_00,&local_99);
  std::allocator<pstore::repo::linked_definitions::value_type>::~allocator(&local_99);
  first = std::
          vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          ::data((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                  *)local_48);
  pvVar2 = std::
           vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
           ::data((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                   *)local_48);
  sVar3 = std::
          vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          ::size((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                  *)local_48);
  (anonymous_namespace)::LinkedDefinitionsSection::export_fragment_abi_cxx11_
            ((string *)local_d0,this,first,pvVar2 + sVar3);
  std::unique_lock<mock_mutex>::unique_lock(&local_120,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_110,
          &(this->super_LinkedDefinitionsSection).import_db_,&local_120);
  std::unique_lock<mock_mutex>::~unique_lock(&local_120);
  pstore::extent<pstore::repo::fragment>::extent((extent<pstore::repo::fragment> *)&str);
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x_00.size = 0x9abcdef0;
  x_00.addr.a_.a_ = (address)0x12345678;
  d.v_._4_4_ = in_stack_fffffffffffff5bc;
  d.v_._0_4_ = 4;
  d.v_._8_4_ = 0;
  d.v_._12_4_ = in_stack_fffffffffffff5c4;
  pstore::repo::definition::definition(&local_1d8,d,x_00,str,(linkage)fext.addr.a_.a_,default_vis);
  x.size = 0x9abcdef0;
  x.addr.a_.a_ = (address)0x12345678;
  d_00.v_._4_4_ = in_stack_fffffffffffff5bc;
  d_00.v_._0_4_ = 4;
  d_00.v_._8_4_ = 0;
  d_00.v_._12_4_ = in_stack_fffffffffffff5c4;
  args_2 = definitions.
           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pstore::repo::definition::definition
            (&local_1a8,d_00,x,str,(linkage)fext.addr.a_.a_,
             (visibility)
             definitions.
             super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_170 = 2;
  this_00 = (allocator<pstore::repo::definition> *)
            ((long)&compilation_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 7);
  local_178 = &local_1d8;
  std::allocator<pstore::repo::definition>::allocator(this_00);
  __l._M_len = local_170;
  __l._M_array = local_178;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             local_168,__l,this_00);
  std::allocator<pstore::repo::definition>::~allocator
            ((allocator<pstore::repo::definition> *)
             ((long)&compilation_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  db = pstore::transaction_base::db((transaction_base *)local_110);
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)local_248,db,true);
  this_01 = std::
            __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_248);
  triple = definitions.
           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  first_member = std::
                 begin<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                           ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                             *)local_168);
  last_member = std::
                end<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                          ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                            *)local_168);
  local_378 = (_List_node_base)
              pstore::repo::compilation::
              alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                        ((transaction<std::unique_lock<mock_mutex>_> *)local_110,
                         (typed_address<pstore::indirect_string>)triple,
                         (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                          )first_member._M_current,
                         (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                          )last_member._M_current);
  std::make_pair<pstore::uint128_const&,pstore::extent<pstore::repo::compilation>>
            (&local_368,(uint128 *)&max_addr,(extent<pstore::repo::compilation> *)&local_378);
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert<pstore::uint128,pstore::extent<pstore::repo::compilation>,void>
            (&local_340,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)this_01,(transaction_base *)local_110,&local_368);
  std::
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  ::~pair(&local_340);
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)local_248);
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::~vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             local_168);
  pstore::transaction_base::commit((transaction_base *)local_110);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_110);
  _auStack_3a8 = (pointer)0x9abcdef0;
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket,
             (mutex_type *)&transaction_1.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_3e8,
          &(this->super_LinkedDefinitionsSection).import_db_,
          (unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket);
  std::unique_lock<mock_mutex>::~unique_lock
            ((unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket);
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)&parser.coordinate_)
  ;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (_anonymous_namespace_ *)&(this->super_LinkedDefinitionsSection).import_db_,
             (database *)local_3e8,(transaction<std::unique_lock<mock_mutex>_> *)&parser.coordinate_
             ,(string_mapping *)auStack_3a8,&args_2->digest);
  this_02 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
                       (string *)local_d0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_02);
  local_531 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_531 = !local_531;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_530,&local_531,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pMVar4 = testing::Message::operator<<(&local_540,(char (*) [17])"JSON error was: ");
    this_03 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_560,this_03);
    pMVar4 = testing::Message::operator<<(pMVar4,&local_560);
    local_561 = ' ';
    pMVar4 = testing::Message::operator<<(pMVar4,&local_561);
    local_56c = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar4 = testing::Message::operator<<(pMVar4,&local_56c);
    local_56d = '\n';
    pMVar4 = testing::Message::operator<<(pMVar4,&local_56d);
    pMVar4 = testing::Message::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_598,(internal *)local_530,(AssertionResult *)0x2ecd1e,"true","false",
               (char *)args_2);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0xaf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_578,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_560);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  if (bVar1) {
    this_04 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::callbacks
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    this_05 = (__shared_ptr_access<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)pstore::exchange::import_ns::callbacks::get_context(this_04);
    this_06 = std::
              __shared_ptr_access<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_05);
    pstore::exchange::import_ns::context::apply_patches(this_06,(transaction_base *)local_3e8);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)&parser.coordinate_);
  if (bVar1) {
    pstore::transaction_base::commit((transaction_base *)local_3e8);
  }
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_3e8);
  if (bVar1) {
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&pos.pos_,&(this->super_LinkedDefinitionsSection).import_db_,true);
    peVar6 = std::
             __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pos.pos_);
    pstore::index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::find<pstore::uint128,void>
              ((const_iterator *)&gtest_ar.message_,
               (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                *)peVar6,&(this->super_LinkedDefinitionsSection).import_db_,(uint128 *)auStack_3a8);
    peVar6 = std::
             __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pos.pos_);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::end(&local_7b8,peVar6,&(this->super_LinkedDefinitionsSection).import_db_);
    testing::internal::
    CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
              ((internal *)local_6c8,"pos","fragments_index->end (import_db_)",
               (iterator_base<true> *)&gtest_ar.message_,&local_7b8);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<false>::~iterator_base(&local_7b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
    if (!bVar1) {
      testing::Message::Message(&local_7c0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &imported_fragment.
                  super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                 ,0xbd,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &imported_fragment.
                  super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_7c0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &imported_fragment.
                  super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      testing::Message::~Message(&local_7c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
    if (bVar1) {
      ppVar7 = pstore::index::
               hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::iterator_base<true>::operator->((iterator_base<true> *)&gtest_ar.message_);
      pstore::repo::fragment::load
                ((fragment *)&gtest_ar__1.message_,
                 &(this->super_LinkedDefinitionsSection).import_db_,&ppVar7->second);
      peVar8 = std::
               __shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&gtest_ar__1.message_);
      local_7e9 = pstore::repo::fragment::has_section(peVar8,linked_definitions);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_7e8,&local_7e9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
      if (!bVar1) {
        testing::Message::Message(&local_7f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&linked,(internal *)local_7e8,
                   (AssertionResult *)
                   "imported_fragment->has_section (repo::section_kind::linked_definitions)","false"
                   ,"true",(char *)args_2);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_800,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0xbf,pcVar5);
        testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
        testing::internal::AssertHelper::~AssertHelper(&local_800);
        std::__cxx11::string::~string((string *)&linked);
        testing::Message::~Message(&local_7f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
      if (bVar1) {
        peVar8 = std::
                 __shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&gtest_ar__1.message_);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )pstore::repo::fragment::at<(pstore::repo::section_kind)18>(peVar8);
        local_840 = pstore::repo::linked_definitions::size
                              ((linked_definitions *)
                               gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
        local_844 = 2;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  ((EqHelper *)local_838,"linked.size ()","2U",&local_840,&local_844);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
        if (!bVar1) {
          testing::Message::Message(&local_850);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&expos,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                     ,0xc2,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&expos,&local_850);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expos);
          testing::Message::~Message(&local_850);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
        if (bVar1) {
          impos = (const_iterator)
                  std::
                  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                  ::begin((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
                           *)local_48);
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )pstore::repo::linked_definitions::begin
                           ((linked_definitions *)
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
          pvVar9 = __gnu_cxx::
                   __normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                   ::operator->((__normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                                 *)&impos);
          testing::internal::EqHelper::Compare<pstore::uint128,_pstore::uint128,_nullptr>
                    ((EqHelper *)local_878,"expos->compilation","impos->compilation",
                     &pvVar9->compilation,
                     (uint128 *)
                     gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
          if (!bVar1) {
            testing::Message::Message(&local_880);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                       ,0xc5,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_880);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_880);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
          pvVar9 = __gnu_cxx::
                   __normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                   ::operator->((__normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                                 *)&impos);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_898,"expos->index","impos->index",&pvVar9->index,
                     (uint *)((long)gtest_ar_2.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 0x10));
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
          if (!bVar1) {
            testing::Message::Message(&local_8a0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                       ,0xc6,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_8a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_8a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
          anon_unknown.dwarf_256343::check_linked_definition
                    (&(this->super_LinkedDefinitionsSection).import_db_,
                     (value_type *)
                     gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          __gnu_cxx::
          __normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
          ::operator++((__normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                        *)&impos);
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )((long)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x20);
          pvVar9 = __gnu_cxx::
                   __normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                   ::operator->((__normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                                 *)&impos);
          testing::internal::EqHelper::Compare<pstore::uint128,_pstore::uint128,_nullptr>
                    ((EqHelper *)local_8b8,"expos->compilation","impos->compilation",
                     &pvVar9->compilation,
                     (uint128 *)
                     gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
          if (!bVar1) {
            testing::Message::Message(&local_8c0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                       ,0xca,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_8c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_8c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
          pvVar9 = __gnu_cxx::
                   __normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                   ::operator->((__normal_iterator<pstore::repo::linked_definitions::value_type_*,_std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
                                 *)&impos);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_8d8,"expos->index","impos->index",&pvVar9->index,
                     (uint *)((long)gtest_ar_2.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 0x10));
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
          if (!bVar1) {
            testing::Message::Message(&local_8e0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_8e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                       ,0xcb,pcVar5);
            testing::internal::AssertHelper::operator=(&local_8e8,&local_8e0);
            testing::internal::AssertHelper::~AssertHelper(&local_8e8);
            testing::Message::~Message(&local_8e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
          anon_unknown.dwarf_256343::check_linked_definition
                    (&(this->super_LinkedDefinitionsSection).import_db_,
                     (value_type *)
                     gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
        }
      }
      std::shared_ptr<const_pstore::repo::fragment>::~shared_ptr
                ((shared_ptr<const_pstore::repo::fragment> *)&gtest_ar__1.message_);
    }
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::~iterator_base((iterator_base<true> *)&gtest_ar.message_);
    std::
    shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&pos.pos_);
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::~vector((vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             *)local_48);
  return;
}

Assistant:

TEST_F (LinkedDefinitionsSection, RoundTripForPopulated) {
    using testing::ContainerEq;
    constexpr auto referenced_compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    constexpr auto max_addr =
        typed_address<repo::definition>::make (std::numeric_limits<std::uint64_t>::max ());
    std::vector<repo::linked_definitions::value_type> exported_content{
        {referenced_compilation_digest, UINT32_C (0), max_addr},
        {referenced_compilation_digest, UINT32_C (1), max_addr},
    };

    // Build and export a fragment which contains a linked-definitions section with the contents
    // supplied from the export_content vector. The resulting JSON is in exported_json.
    std::string exported_json = this->export_fragment (
        exported_content.data (), exported_content.data () + exported_content.size ());

    // Now build the import database. First we we create a compilation that the linked-definition
    // fragment will later reference.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            constexpr index::digest fragment_digest{0x9ABCDEF0, 0x12345678};
            pstore::extent<repo::fragment> const fext;
            constexpr auto str = pstore::typed_address<pstore::indirect_string>::make (0U);
            std::vector<repo::definition> definitions{
                {fragment_digest, fext, str, pstore::repo::linkage::external},
                {fragment_digest, fext, str, pstore::repo::linkage::external},
            };
            auto compilation_index =
                pstore::index::get_index<pstore::trailer::indices::compilation> (transaction.db ());
            compilation_index->insert (
                transaction, std::make_pair (referenced_compilation_digest,
                                             repo::compilation::alloc (transaction, str /*triple*/,
                                                                       std::begin (definitions),
                                                                       std::end (definitions))));
        }
        transaction.commit ();
    }

    constexpr auto imported_digest = pstore::index::digest{0x31415192, 0x9ABCDEF0};
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            exchange::import_ns::string_mapping imported_names;
            auto parser = make_json_object_parser<exchange::import_ns::fragment_sections> (
                &import_db_, &transaction, &imported_names, &imported_digest);
            parser.input (exported_json).eof ();
            ASSERT_FALSE (parser.has_error ())
                << "JSON error was: " << parser.last_error ().message () << ' '
                << parser.coordinate () << '\n'
                << exported_json;

            std::shared_ptr<exchange::import_ns::context> const & ctxt =
                parser.callbacks ().get_context ();
            ctxt->apply_patches (&transaction);
        }
        transaction.commit ();
    }

    auto fragments_index = index::get_index<trailer::indices::fragment> (import_db_);
    auto pos = fragments_index->find (import_db_, imported_digest);
    ASSERT_NE (pos, fragments_index->end (import_db_));
    auto imported_fragment = repo::fragment::load (import_db_, pos->second);
    ASSERT_TRUE (imported_fragment->has_section (repo::section_kind::linked_definitions));
    repo::linked_definitions const & linked =
        imported_fragment->at<repo::section_kind::linked_definitions> ();
    ASSERT_EQ (linked.size (), 2U);
    auto expos = exported_content.begin ();
    auto impos = linked.begin ();
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
    ++expos;
    ++impos;
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
}